

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O2

bool __thiscall ON_PolyCurve::IsLinear(ON_PolyCurve *this,double tolerance)

{
  uint uVar1;
  ON_Curve *pOVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar1 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  if ((ulong)uVar1 == 1) {
    iVar4 = (*((*(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a)->super_ON_Geometry).
              super_ON_Object._vptr_ON_Object[0x2e])();
    return SUB41(iVar4,0);
  }
  if ((int)uVar1 < 2) {
    bVar3 = 0;
  }
  else {
    uVar5 = 1;
    for (uVar6 = 0; (bVar3 = (byte)uVar5, (uVar5 & 1) != 0 && (uVar6 < uVar1)); uVar6 = uVar6 + 1) {
      pOVar2 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar6];
      if (pOVar2 == (ON_Curve *)0x0) {
        uVar5 = 0;
      }
      else {
        uVar5 = (*(pOVar2->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2e])(tolerance);
      }
    }
    if ((uVar5 & 1) != 0) {
      bVar3 = ON_Curve::IsLinear(&this->super_ON_Curve,tolerance);
    }
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool
ON_PolyCurve::IsLinear( // true if curve locus is a line segment
      double tolerance // tolerance to use when checking linearity
      ) const
{
  bool rc = false;
  int i, count = Count();
	if ( count==1)
		return m_segment[0]->IsLinear(tolerance);
  
	else if ( count > 1 ) {
    rc = true;
    for ( i = 0; rc && i < count; i++ ) {
      if ( !m_segment[i] )
        rc = false;
      else
        rc = m_segment[i]->IsLinear(tolerance);
    
    }
    if (rc)
      rc = ON_Curve::IsLinear(tolerance);
  }
  return rc;
}